

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void dxil_spv::CFGStructurizer::merge_to_succ(CFGNode *node,uint index)

{
  CFGNode *local_18;
  
  local_18 = node;
  std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::push_back
            (&(node->succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start[index]->headers,&local_18);
  local_18->selection_merge_block =
       (local_18->succ).
       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start[index];
  local_18->merge = Selection;
  return;
}

Assistant:

void CFGStructurizer::merge_to_succ(CFGNode *node, unsigned index)
{
	node->succ[index]->headers.push_back(node);
	node->selection_merge_block = node->succ[index];
	node->merge = MergeType::Selection;
	//LOGI("Fixup selection merge %s -> %s\n", node->name.c_str(), node->selection_merge_block->name.c_str());
}